

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

int bifinh(voccxdef *voc,vocidef *v,objnum cls)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  
  if ((v != (vocidef *)0x0) && (bVar1 = v->vocinsc, bVar1 != 0)) {
    lVar4 = 0;
    do {
      uVar2 = *(ushort *)((long)&v->vociu + lVar4 * 2 + 6);
      if (uVar2 == cls) {
        return 1;
      }
      iVar3 = bifinh(voc,voc->voccxinh[uVar2 >> 8][(byte)uVar2],cls);
      if (iVar3 != 0) {
        return 1;
      }
      lVar4 = lVar4 + 1;
    } while ((uint)bVar1 != (uint)lVar4);
  }
  return 0;
}

Assistant:

int bifinh(voccxdef *voc, vocidef *v, objnum cls)
{
    int     i;
    objnum *sc;

    if (!v) return(FALSE);
    for (i = v->vocinsc, sc = v->vocisc ; i ; ++sc, --i)
    {
        if (*sc == cls
            || bifinh(voc, vocinh(voc, *sc), cls))
            return(TRUE);
    }
    return(FALSE);
}